

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::NetworkLocator::NetworkLocator(NetworkLocator *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  MDDEntry *pMVar3;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__NetworkLocator_002184b8;
  (this->URLString).super_string._M_dataplus._M_p = (pointer)&(this->URLString).super_string.field_2
  ;
  (this->URLString).super_string._M_string_length = 0;
  (this->URLString).super_string.field_2._M_local_buf[0] = '\0';
  (this->URLString).super_IArchive._vptr_IArchive = (_func_int **)&PTR__UTF16String_00215c60;
  this_00 = (this->super_InterchangeObject).m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar3 = Dictionary::Type(this_00,MDD_NetworkLocator);
    uVar1 = *(undefined8 *)pMVar3->ul;
    uVar2 = *(undefined8 *)(pMVar3->ul + 8);
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xe45,"ASDCP::MXF::NetworkLocator::NetworkLocator(const Dictionary *)");
}

Assistant:

NetworkLocator::NetworkLocator(const Dictionary* d) : InterchangeObject(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_NetworkLocator);
}